

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderLibraryCase.cpp
# Opt level: O0

void deqp::sl::setUniformValue
               (Functions *gl,deUint32 programID,string *name,Value *val,int arrayNdx)

{
  glGetUniformLocationFunc p_Var1;
  glUniform1fvFunc p_Var2;
  glUniform2fvFunc p_Var3;
  glUniform3fvFunc p_Var4;
  glUniform4fvFunc p_Var5;
  glUniformMatrix2fvFunc p_Var6;
  glUniformMatrix3fvFunc p_Var7;
  glUniformMatrix4fvFunc p_Var8;
  glUniform1ivFunc p_Var9;
  glUniform2ivFunc p_Var10;
  glUniform3ivFunc p_Var11;
  glUniform4ivFunc p_Var12;
  glUniform1uivFunc p_Var13;
  glUniform2uivFunc p_Var14;
  glUniform3uivFunc p_Var15;
  glUniform4uivFunc p_Var16;
  glUniformMatrix2x3fvFunc p_Var17;
  glUniformMatrix2x4fvFunc p_Var18;
  glUniformMatrix3x2fvFunc p_Var19;
  glUniformMatrix3x4fvFunc p_Var20;
  glUniformMatrix4x2fvFunc p_Var21;
  glUniformMatrix4x3fvFunc p_Var22;
  GLint GVar23;
  deBool dVar24;
  GLchar *pGVar25;
  TestError *this;
  const_reference pvVar26;
  int local_64;
  int elemNdx;
  int loc;
  int scalarSize;
  int arrayNdx_local;
  Value *val_local;
  string *name_local;
  deUint32 programID_local;
  Functions *gl_local;
  
  local_64 = glu::getDataTypeScalarSize(val->dataType);
  p_Var1 = gl->getUniformLocation;
  pGVar25 = (GLchar *)std::__cxx11::string::c_str();
  GVar23 = (*p_Var1)(programID,pGVar25);
  while ((dVar24 = ::deGetFalse(), dVar24 == 0 && (GVar23 != -1))) {
    dVar24 = ::deGetFalse();
    if (dVar24 == 0) {
      if (val->arrayLength == 1) {
        local_64 = 0;
      }
      else {
        local_64 = arrayNdx * local_64;
      }
      switch(val->dataType) {
      case TYPE_FLOAT:
        p_Var2 = gl->uniform1fv;
        pvVar26 = std::
                  vector<deqp::sl::ShaderCase::Value::Element,_std::allocator<deqp::sl::ShaderCase::Value::Element>_>
                  ::operator[](&val->elements,(long)local_64);
        (*p_Var2)(GVar23,1,(GLfloat *)pvVar26);
        break;
      case TYPE_FLOAT_VEC2:
        p_Var3 = gl->uniform2fv;
        pvVar26 = std::
                  vector<deqp::sl::ShaderCase::Value::Element,_std::allocator<deqp::sl::ShaderCase::Value::Element>_>
                  ::operator[](&val->elements,(long)local_64);
        (*p_Var3)(GVar23,1,(GLfloat *)pvVar26);
        break;
      case TYPE_FLOAT_VEC3:
        p_Var4 = gl->uniform3fv;
        pvVar26 = std::
                  vector<deqp::sl::ShaderCase::Value::Element,_std::allocator<deqp::sl::ShaderCase::Value::Element>_>
                  ::operator[](&val->elements,(long)local_64);
        (*p_Var4)(GVar23,1,(GLfloat *)pvVar26);
        break;
      case TYPE_FLOAT_VEC4:
        p_Var5 = gl->uniform4fv;
        pvVar26 = std::
                  vector<deqp::sl::ShaderCase::Value::Element,_std::allocator<deqp::sl::ShaderCase::Value::Element>_>
                  ::operator[](&val->elements,(long)local_64);
        (*p_Var5)(GVar23,1,(GLfloat *)pvVar26);
        break;
      case TYPE_FLOAT_MAT2:
        p_Var6 = gl->uniformMatrix2fv;
        pvVar26 = std::
                  vector<deqp::sl::ShaderCase::Value::Element,_std::allocator<deqp::sl::ShaderCase::Value::Element>_>
                  ::operator[](&val->elements,(long)local_64);
        (*p_Var6)(GVar23,1,'\0',(GLfloat *)pvVar26);
        break;
      case TYPE_FLOAT_MAT2X3:
        p_Var17 = gl->uniformMatrix2x3fv;
        pvVar26 = std::
                  vector<deqp::sl::ShaderCase::Value::Element,_std::allocator<deqp::sl::ShaderCase::Value::Element>_>
                  ::operator[](&val->elements,(long)local_64);
        (*p_Var17)(GVar23,1,'\0',(GLfloat *)pvVar26);
        break;
      case TYPE_FLOAT_MAT2X4:
        p_Var18 = gl->uniformMatrix2x4fv;
        pvVar26 = std::
                  vector<deqp::sl::ShaderCase::Value::Element,_std::allocator<deqp::sl::ShaderCase::Value::Element>_>
                  ::operator[](&val->elements,(long)local_64);
        (*p_Var18)(GVar23,1,'\0',(GLfloat *)pvVar26);
        break;
      case TYPE_FLOAT_MAT3X2:
        p_Var19 = gl->uniformMatrix3x2fv;
        pvVar26 = std::
                  vector<deqp::sl::ShaderCase::Value::Element,_std::allocator<deqp::sl::ShaderCase::Value::Element>_>
                  ::operator[](&val->elements,(long)local_64);
        (*p_Var19)(GVar23,1,'\0',(GLfloat *)pvVar26);
        break;
      case TYPE_FLOAT_MAT3:
        p_Var7 = gl->uniformMatrix3fv;
        pvVar26 = std::
                  vector<deqp::sl::ShaderCase::Value::Element,_std::allocator<deqp::sl::ShaderCase::Value::Element>_>
                  ::operator[](&val->elements,(long)local_64);
        (*p_Var7)(GVar23,1,'\0',(GLfloat *)pvVar26);
        break;
      case TYPE_FLOAT_MAT3X4:
        p_Var20 = gl->uniformMatrix3x4fv;
        pvVar26 = std::
                  vector<deqp::sl::ShaderCase::Value::Element,_std::allocator<deqp::sl::ShaderCase::Value::Element>_>
                  ::operator[](&val->elements,(long)local_64);
        (*p_Var20)(GVar23,1,'\0',(GLfloat *)pvVar26);
        break;
      case TYPE_FLOAT_MAT4X2:
        p_Var21 = gl->uniformMatrix4x2fv;
        pvVar26 = std::
                  vector<deqp::sl::ShaderCase::Value::Element,_std::allocator<deqp::sl::ShaderCase::Value::Element>_>
                  ::operator[](&val->elements,(long)local_64);
        (*p_Var21)(GVar23,1,'\0',(GLfloat *)pvVar26);
        break;
      case TYPE_FLOAT_MAT4X3:
        p_Var22 = gl->uniformMatrix4x3fv;
        pvVar26 = std::
                  vector<deqp::sl::ShaderCase::Value::Element,_std::allocator<deqp::sl::ShaderCase::Value::Element>_>
                  ::operator[](&val->elements,(long)local_64);
        (*p_Var22)(GVar23,1,'\0',(GLfloat *)pvVar26);
        break;
      case TYPE_FLOAT_MAT4:
        p_Var8 = gl->uniformMatrix4fv;
        pvVar26 = std::
                  vector<deqp::sl::ShaderCase::Value::Element,_std::allocator<deqp::sl::ShaderCase::Value::Element>_>
                  ::operator[](&val->elements,(long)local_64);
        (*p_Var8)(GVar23,1,'\0',(GLfloat *)pvVar26);
        break;
      default:
        break;
      case TYPE_INT:
        p_Var9 = gl->uniform1iv;
        pvVar26 = std::
                  vector<deqp::sl::ShaderCase::Value::Element,_std::allocator<deqp::sl::ShaderCase::Value::Element>_>
                  ::operator[](&val->elements,(long)local_64);
        (*p_Var9)(GVar23,1,(GLint *)pvVar26);
        break;
      case TYPE_INT_VEC2:
        p_Var10 = gl->uniform2iv;
        pvVar26 = std::
                  vector<deqp::sl::ShaderCase::Value::Element,_std::allocator<deqp::sl::ShaderCase::Value::Element>_>
                  ::operator[](&val->elements,(long)local_64);
        (*p_Var10)(GVar23,1,(GLint *)pvVar26);
        break;
      case TYPE_INT_VEC3:
        p_Var11 = gl->uniform3iv;
        pvVar26 = std::
                  vector<deqp::sl::ShaderCase::Value::Element,_std::allocator<deqp::sl::ShaderCase::Value::Element>_>
                  ::operator[](&val->elements,(long)local_64);
        (*p_Var11)(GVar23,1,(GLint *)pvVar26);
        break;
      case TYPE_INT_VEC4:
        p_Var12 = gl->uniform4iv;
        pvVar26 = std::
                  vector<deqp::sl::ShaderCase::Value::Element,_std::allocator<deqp::sl::ShaderCase::Value::Element>_>
                  ::operator[](&val->elements,(long)local_64);
        (*p_Var12)(GVar23,1,(GLint *)pvVar26);
        break;
      case TYPE_UINT:
        p_Var13 = gl->uniform1uiv;
        pvVar26 = std::
                  vector<deqp::sl::ShaderCase::Value::Element,_std::allocator<deqp::sl::ShaderCase::Value::Element>_>
                  ::operator[](&val->elements,(long)local_64);
        (*p_Var13)(GVar23,1,(GLuint *)pvVar26);
        break;
      case TYPE_UINT_VEC2:
        p_Var14 = gl->uniform2uiv;
        pvVar26 = std::
                  vector<deqp::sl::ShaderCase::Value::Element,_std::allocator<deqp::sl::ShaderCase::Value::Element>_>
                  ::operator[](&val->elements,(long)local_64);
        (*p_Var14)(GVar23,1,(GLuint *)pvVar26);
        break;
      case TYPE_UINT_VEC3:
        p_Var15 = gl->uniform3uiv;
        pvVar26 = std::
                  vector<deqp::sl::ShaderCase::Value::Element,_std::allocator<deqp::sl::ShaderCase::Value::Element>_>
                  ::operator[](&val->elements,(long)local_64);
        (*p_Var15)(GVar23,1,(GLuint *)pvVar26);
        break;
      case TYPE_UINT_VEC4:
        p_Var16 = gl->uniform4uiv;
        pvVar26 = std::
                  vector<deqp::sl::ShaderCase::Value::Element,_std::allocator<deqp::sl::ShaderCase::Value::Element>_>
                  ::operator[](&val->elements,(long)local_64);
        (*p_Var16)(GVar23,1,(GLuint *)pvVar26);
        break;
      case TYPE_BOOL:
        p_Var9 = gl->uniform1iv;
        pvVar26 = std::
                  vector<deqp::sl::ShaderCase::Value::Element,_std::allocator<deqp::sl::ShaderCase::Value::Element>_>
                  ::operator[](&val->elements,(long)local_64);
        (*p_Var9)(GVar23,1,(GLint *)pvVar26);
        break;
      case TYPE_BOOL_VEC2:
        p_Var10 = gl->uniform2iv;
        pvVar26 = std::
                  vector<deqp::sl::ShaderCase::Value::Element,_std::allocator<deqp::sl::ShaderCase::Value::Element>_>
                  ::operator[](&val->elements,(long)local_64);
        (*p_Var10)(GVar23,1,(GLint *)pvVar26);
        break;
      case TYPE_BOOL_VEC3:
        p_Var11 = gl->uniform3iv;
        pvVar26 = std::
                  vector<deqp::sl::ShaderCase::Value::Element,_std::allocator<deqp::sl::ShaderCase::Value::Element>_>
                  ::operator[](&val->elements,(long)local_64);
        (*p_Var11)(GVar23,1,(GLint *)pvVar26);
        break;
      case TYPE_BOOL_VEC4:
        p_Var12 = gl->uniform4iv;
        pvVar26 = std::
                  vector<deqp::sl::ShaderCase::Value::Element,_std::allocator<deqp::sl::ShaderCase::Value::Element>_>
                  ::operator[](&val->elements,(long)local_64);
        (*p_Var12)(GVar23,1,(GLint *)pvVar26);
        break;
      case TYPE_SAMPLER_2D:
      case TYPE_SAMPLER_CUBE:
      }
      return;
    }
  }
  this = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this,"uniform location not found","loc != -1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderLibraryCase.cpp"
             ,0x81);
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

static void setUniformValue(const glw::Functions& gl, deUint32 programID, const std::string& name,
							const ShaderCase::Value& val, int arrayNdx)
{
	int scalarSize = getDataTypeScalarSize(val.dataType);
	int loc		   = gl.getUniformLocation(programID, name.c_str());

	TCU_CHECK_MSG(loc != -1, "uniform location not found");

	DE_STATIC_ASSERT(sizeof(ShaderCase::Value::Element) == sizeof(glw::GLfloat));
	DE_STATIC_ASSERT(sizeof(ShaderCase::Value::Element) == sizeof(glw::GLint));

	int elemNdx = (val.arrayLength == 1) ? 0 : (arrayNdx * scalarSize);

	switch (val.dataType)
	{
	case TYPE_FLOAT:
		gl.uniform1fv(loc, 1, &val.elements[elemNdx].float32);
		break;
	case TYPE_FLOAT_VEC2:
		gl.uniform2fv(loc, 1, &val.elements[elemNdx].float32);
		break;
	case TYPE_FLOAT_VEC3:
		gl.uniform3fv(loc, 1, &val.elements[elemNdx].float32);
		break;
	case TYPE_FLOAT_VEC4:
		gl.uniform4fv(loc, 1, &val.elements[elemNdx].float32);
		break;
	case TYPE_FLOAT_MAT2:
		gl.uniformMatrix2fv(loc, 1, GL_FALSE, &val.elements[elemNdx].float32);
		break;
	case TYPE_FLOAT_MAT3:
		gl.uniformMatrix3fv(loc, 1, GL_FALSE, &val.elements[elemNdx].float32);
		break;
	case TYPE_FLOAT_MAT4:
		gl.uniformMatrix4fv(loc, 1, GL_FALSE, &val.elements[elemNdx].float32);
		break;
	case TYPE_INT:
		gl.uniform1iv(loc, 1, &val.elements[elemNdx].int32);
		break;
	case TYPE_INT_VEC2:
		gl.uniform2iv(loc, 1, &val.elements[elemNdx].int32);
		break;
	case TYPE_INT_VEC3:
		gl.uniform3iv(loc, 1, &val.elements[elemNdx].int32);
		break;
	case TYPE_INT_VEC4:
		gl.uniform4iv(loc, 1, &val.elements[elemNdx].int32);
		break;
	case TYPE_BOOL:
		gl.uniform1iv(loc, 1, &val.elements[elemNdx].int32);
		break;
	case TYPE_BOOL_VEC2:
		gl.uniform2iv(loc, 1, &val.elements[elemNdx].int32);
		break;
	case TYPE_BOOL_VEC3:
		gl.uniform3iv(loc, 1, &val.elements[elemNdx].int32);
		break;
	case TYPE_BOOL_VEC4:
		gl.uniform4iv(loc, 1, &val.elements[elemNdx].int32);
		break;
	case TYPE_UINT:
		gl.uniform1uiv(loc, 1, (const deUint32*)&val.elements[elemNdx].int32);
		break;
	case TYPE_UINT_VEC2:
		gl.uniform2uiv(loc, 1, (const deUint32*)&val.elements[elemNdx].int32);
		break;
	case TYPE_UINT_VEC3:
		gl.uniform3uiv(loc, 1, (const deUint32*)&val.elements[elemNdx].int32);
		break;
	case TYPE_UINT_VEC4:
		gl.uniform4uiv(loc, 1, (const deUint32*)&val.elements[elemNdx].int32);
		break;
	case TYPE_FLOAT_MAT2X3:
		gl.uniformMatrix2x3fv(loc, 1, GL_FALSE, &val.elements[elemNdx].float32);
		break;
	case TYPE_FLOAT_MAT2X4:
		gl.uniformMatrix2x4fv(loc, 1, GL_FALSE, &val.elements[elemNdx].float32);
		break;
	case TYPE_FLOAT_MAT3X2:
		gl.uniformMatrix3x2fv(loc, 1, GL_FALSE, &val.elements[elemNdx].float32);
		break;
	case TYPE_FLOAT_MAT3X4:
		gl.uniformMatrix3x4fv(loc, 1, GL_FALSE, &val.elements[elemNdx].float32);
		break;
	case TYPE_FLOAT_MAT4X2:
		gl.uniformMatrix4x2fv(loc, 1, GL_FALSE, &val.elements[elemNdx].float32);
		break;
	case TYPE_FLOAT_MAT4X3:
		gl.uniformMatrix4x3fv(loc, 1, GL_FALSE, &val.elements[elemNdx].float32);
		break;

	case TYPE_SAMPLER_2D:
	case TYPE_SAMPLER_CUBE:
		DE_ASSERT(DE_FALSE && "implement!");
		break;

	default:
		DE_ASSERT(false);
	}
}